

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O3

ExceptionInfoResponse * __thiscall
cmDebugger::cmDebuggerExceptionManager::HandleExceptionInfoRequest
          (ExceptionInfoResponse *__return_storage_ptr__,cmDebuggerExceptionManager *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->Mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  (__return_storage_ptr__->breakMode)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->breakMode).field_2;
  *(undefined4 *)&(__return_storage_ptr__->breakMode).field_2 = 0x6576656e;
  *(undefined2 *)((long)&(__return_storage_ptr__->breakMode).field_2 + 4) = 0x72;
  (__return_storage_ptr__->breakMode)._M_string_length = 5;
  (__return_storage_ptr__->description).val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->description).val.field_2;
  (__return_storage_ptr__->description).val._M_string_length = 0;
  (__return_storage_ptr__->description).val.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->description).set = false;
  (__return_storage_ptr__->details).val.evaluateName.val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->details).val.evaluateName.val.field_2 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.evaluateName.set = 0;
  (__return_storage_ptr__->details).val.evaluateName.val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->details).val.evaluateName.val.field_2;
  (__return_storage_ptr__->details).val.evaluateName.val._M_string_length = 0;
  (__return_storage_ptr__->details).val.fullTypeName.val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->details).val.fullTypeName.val.field_2 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.fullTypeName.set = 0;
  (__return_storage_ptr__->details).val.fullTypeName.val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->details).val.fullTypeName.val.field_2;
  (__return_storage_ptr__->details).val.fullTypeName.val._M_string_length = 0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.message.set = 0;
  (__return_storage_ptr__->details).val.message.val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->details).val.message.val.field_2 + 8) = 0;
  (__return_storage_ptr__->details).val.message.val._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->details).val.message.val._M_string_length = 0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->details).val.innerException.val.
           super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.innerException.set = 0;
  (__return_storage_ptr__->details).val.innerException.val.
  super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(__return_storage_ptr__->details).val.innerException.val.
           super__Vector_base<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  (__return_storage_ptr__->details).val.message.val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->details).val.message.val.field_2;
  (__return_storage_ptr__->details).val.stackTrace.val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->details).val.stackTrace.val.field_2 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.stackTrace.set = 0;
  (__return_storage_ptr__->details).val.stackTrace.val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->details).val.stackTrace.val.field_2;
  (__return_storage_ptr__->details).val.stackTrace.val._M_string_length = 0;
  (__return_storage_ptr__->details).val.typeName.val.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->details).val.typeName.val.field_2 + 8) = 0;
  *(undefined8 *)&(__return_storage_ptr__->details).val.typeName.set = 0;
  (__return_storage_ptr__->details).val.typeName.val._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->details).val.typeName.val.field_2;
  (__return_storage_ptr__->details).val.typeName.val._M_string_length = 0;
  (__return_storage_ptr__->details).set = false;
  (__return_storage_ptr__->exceptionId)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->exceptionId).field_2;
  (__return_storage_ptr__->exceptionId)._M_string_length = 0;
  (__return_storage_ptr__->exceptionId).field_2._M_local_buf[0] = '\0';
  if ((this->TheException).super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>.
      _M_payload.super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
      super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_engaged == true) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->exceptionId);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,
               (char *)(__return_storage_ptr__->breakMode)._M_string_length,0x90b042);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->description);
    (__return_storage_ptr__->description).set = true;
    if ((this->TheException).super__Optional_base<cmDebugger::cmDebuggerException,_false,_false>.
        _M_payload.super__Optional_payload<cmDebugger::cmDebuggerException,_true,_false,_false>.
        super__Optional_payload_base<cmDebugger::cmDebuggerException>._M_engaged == true) {
      std::_Optional_payload_base<cmDebugger::cmDebuggerException>::_M_destroy
                ((_Optional_payload_base<cmDebugger::cmDebuggerException> *)&this->TheException);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

dap::ExceptionInfoResponse
cmDebuggerExceptionManager::HandleExceptionInfoRequest()
{
  std::unique_lock<std::mutex> lock(Mutex);

  dap::ExceptionInfoResponse response;
  if (TheException.has_value()) {
    response.exceptionId = TheException->Id;
    response.breakMode = "always";
    response.description = TheException->Description;
    TheException = cm::nullopt;
  }
  return response;
}